

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx::ConeCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  long lVar77;
  Scene *pSVar78;
  undefined1 auVar79 [8];
  undefined4 uVar80;
  ulong uVar81;
  uint uVar82;
  bool bVar83;
  bool bVar84;
  undefined1 auVar85 [16];
  float fVar91;
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar93;
  float fVar97;
  undefined1 auVar90 [32];
  float fVar98;
  undefined1 auVar99 [16];
  float fVar105;
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar107;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar117;
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar114 [32];
  float fVar119;
  undefined1 auVar115 [32];
  float fVar123;
  undefined1 auVar116 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar130 [32];
  float fVar143;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar147;
  undefined1 auVar144 [32];
  float fVar148;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar149;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar172;
  undefined1 auVar165 [32];
  float fVar173;
  undefined1 auVar174 [16];
  float fVar178;
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar180;
  undefined1 auVar177 [64];
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar185 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar206 [64];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined8 local_640;
  undefined8 uStack_638;
  Scene *local_628;
  size_t local_620;
  RTCFilterFunctionNArguments local_618;
  Primitive *local_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  RTCHitN local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar78 = context->scene;
  uVar82 = (line->v0).field_0.i[0];
  pGVar8 = (pSVar78->geometries).items[line->sharedGeomID].ptr;
  lVar77 = *(long *)&pGVar8[1].time_range.upper;
  p_Var9 = pGVar8[1].intersectionFilterN;
  uVar1 = (line->v0).field_0.i[1];
  uVar2 = (line->v0).field_0.i[4];
  uVar3 = (line->v0).field_0.i[5];
  auVar86._16_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)uVar2 * (long)p_Var9);
  auVar86._0_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)uVar82 * (long)p_Var9);
  auVar100._16_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)uVar3 * (long)p_Var9);
  auVar100._0_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)uVar1 * (long)p_Var9);
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[3];
  uVar6 = (line->v0).field_0.i[6];
  auVar114._16_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)uVar6 * (long)p_Var9);
  auVar114._0_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)uVar4 * (long)p_Var9);
  uVar7 = (line->v0).field_0.i[7];
  auVar124._16_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)uVar7 * (long)p_Var9);
  auVar124._0_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)uVar5 * (long)p_Var9);
  auVar161._16_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)(uVar2 + 1) * (long)p_Var9);
  auVar161._0_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)(uVar82 + 1) * (long)p_Var9);
  auVar175._16_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)(uVar3 + 1) * (long)p_Var9);
  auVar175._0_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)(uVar1 + 1) * (long)p_Var9);
  auVar35 = vunpcklps_avx(auVar86,auVar114);
  auVar31 = vunpckhps_avx(auVar86,auVar114);
  auVar36 = vunpcklps_avx(auVar100,auVar124);
  auVar32 = vunpckhps_avx(auVar100,auVar124);
  auVar37 = vunpcklps_avx(auVar35,auVar36);
  auVar33 = vunpckhps_avx(auVar35,auVar36);
  auVar38 = vunpcklps_avx(auVar31,auVar32);
  auVar34 = vunpckhps_avx(auVar31,auVar32);
  auVar87._16_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)(uVar6 + 1) * (long)p_Var9);
  auVar87._0_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)(uVar4 + 1) * (long)p_Var9);
  auVar101._16_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)(uVar7 + 1) * (long)p_Var9);
  auVar101._0_16_ = *(undefined1 (*) [16])(lVar77 + (ulong)(uVar5 + 1) * (long)p_Var9);
  auVar35 = vunpcklps_avx(auVar161,auVar87);
  auVar31 = vunpckhps_avx(auVar161,auVar87);
  auVar36 = vunpcklps_avx(auVar175,auVar101);
  auVar32 = vunpckhps_avx(auVar175,auVar101);
  auVar100 = vunpcklps_avx(auVar35,auVar36);
  auVar86 = vunpckhps_avx(auVar35,auVar36);
  auVar101 = vunpcklps_avx(auVar31,auVar32);
  auVar87 = vunpckhps_avx(auVar31,auVar32);
  auVar85 = vpcmpeqd_avx(auVar87._0_16_,auVar87._0_16_);
  auVar99 = vpcmpeqd_avx(auVar85,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar85 = vpcmpeqd_avx(auVar85,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_210 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  local_220 = local_210;
  local_240 = *(float *)(ray + k * 4 + 0x40);
  local_260 = *(float *)(ray + k * 4 + 0x50);
  fVar184 = *(float *)(ray + k * 4 + 0x60);
  auVar88._16_16_ = auVar85;
  auVar88._0_16_ = auVar99;
  auVar85 = ZEXT416((uint)(local_240 * local_240 + local_260 * local_260 + fVar184 * fVar184));
  auVar85 = vshufps_avx(auVar85,auVar85,0);
  auVar89._16_16_ = auVar85;
  auVar89._0_16_ = auVar85;
  auVar31 = vrcpps_avx(auVar89);
  fVar111 = auVar31._0_4_;
  fVar117 = auVar31._4_4_;
  auVar32._4_4_ = fVar117 * auVar85._4_4_;
  auVar32._0_4_ = fVar111 * auVar85._0_4_;
  fVar118 = auVar31._8_4_;
  auVar32._8_4_ = fVar118 * auVar85._8_4_;
  fVar119 = auVar31._12_4_;
  auVar32._12_4_ = fVar119 * auVar85._12_4_;
  fVar120 = auVar31._16_4_;
  auVar32._16_4_ = fVar120 * auVar85._0_4_;
  fVar121 = auVar31._20_4_;
  auVar32._20_4_ = fVar121 * auVar85._4_4_;
  fVar122 = auVar31._24_4_;
  auVar32._24_4_ = fVar122 * auVar85._8_4_;
  auVar32._28_4_ = auVar85._12_4_;
  auVar125._8_4_ = 0x3f800000;
  auVar125._0_8_ = &DAT_3f8000003f800000;
  auVar125._12_4_ = 0x3f800000;
  auVar125._16_4_ = 0x3f800000;
  auVar125._20_4_ = 0x3f800000;
  auVar125._24_4_ = 0x3f800000;
  auVar125._28_4_ = 0x3f800000;
  auVar32 = vsubps_avx(auVar125,auVar32);
  fVar97 = auVar31._28_4_ + auVar32._28_4_;
  fStack_3c4 = auVar100._28_4_;
  auVar36._4_4_ = (auVar37._4_4_ + auVar100._4_4_) * 0.5;
  auVar36._0_4_ = (auVar37._0_4_ + auVar100._0_4_) * 0.5;
  auVar36._8_4_ = (auVar37._8_4_ + auVar100._8_4_) * 0.5;
  auVar36._12_4_ = (auVar37._12_4_ + auVar100._12_4_) * 0.5;
  auVar36._16_4_ = (auVar37._16_4_ + auVar100._16_4_) * 0.5;
  auVar36._20_4_ = (auVar37._20_4_ + auVar100._20_4_) * 0.5;
  auVar36._24_4_ = (auVar37._24_4_ + auVar100._24_4_) * 0.5;
  auVar36._28_4_ = auVar37._28_4_ + fStack_3c4;
  auVar31._4_4_ = (auVar33._4_4_ + auVar86._4_4_) * 0.5;
  auVar31._0_4_ = (auVar33._0_4_ + auVar86._0_4_) * 0.5;
  auVar31._8_4_ = (auVar33._8_4_ + auVar86._8_4_) * 0.5;
  auVar31._12_4_ = (auVar33._12_4_ + auVar86._12_4_) * 0.5;
  auVar31._16_4_ = (auVar33._16_4_ + auVar86._16_4_) * 0.5;
  auVar31._20_4_ = (auVar33._20_4_ + auVar86._20_4_) * 0.5;
  auVar31._24_4_ = (auVar33._24_4_ + auVar86._24_4_) * 0.5;
  auVar31._28_4_ = auVar33._28_4_ + auVar86._28_4_;
  auVar35._4_4_ = (auVar101._4_4_ + auVar38._4_4_) * 0.5;
  auVar35._0_4_ = (auVar101._0_4_ + auVar38._0_4_) * 0.5;
  auVar35._8_4_ = (auVar101._8_4_ + auVar38._8_4_) * 0.5;
  auVar35._12_4_ = (auVar101._12_4_ + auVar38._12_4_) * 0.5;
  auVar35._16_4_ = (auVar101._16_4_ + auVar38._16_4_) * 0.5;
  auVar35._20_4_ = (auVar101._20_4_ + auVar38._20_4_) * 0.5;
  auVar35._24_4_ = (auVar101._24_4_ + auVar38._24_4_) * 0.5;
  auVar35._28_4_ = 0x3f000000;
  fVar172 = *(float *)(ray + k * 4 + 0x10);
  auVar162._4_4_ = fVar172;
  auVar162._0_4_ = fVar172;
  auVar162._8_4_ = fVar172;
  auVar162._12_4_ = fVar172;
  auVar162._16_4_ = fVar172;
  auVar162._20_4_ = fVar172;
  auVar162._24_4_ = fVar172;
  auVar162._28_4_ = fVar172;
  auVar31 = vsubps_avx(auVar31,auVar162);
  fVar186 = *(float *)(ray + k * 4 + 0x20);
  auVar176._4_4_ = fVar186;
  auVar176._0_4_ = fVar186;
  auVar176._8_4_ = fVar186;
  auVar176._12_4_ = fVar186;
  auVar176._16_4_ = fVar186;
  auVar176._20_4_ = fVar186;
  auVar176._24_4_ = fVar186;
  auVar176._28_4_ = fVar186;
  auVar35 = vsubps_avx(auVar35,auVar176);
  fStack_3e4 = auVar31._28_4_ + auVar35._28_4_;
  fVar187 = *(float *)(ray + k * 4);
  auVar150._4_4_ = fVar187;
  auVar150._0_4_ = fVar187;
  auVar150._8_4_ = fVar187;
  auVar150._12_4_ = fVar187;
  auVar150._16_4_ = fVar187;
  auVar150._20_4_ = fVar187;
  auVar150._24_4_ = fVar187;
  auVar150._28_4_ = fVar187;
  auVar36 = vsubps_avx(auVar36,auVar150);
  local_3e0 = (local_240 * auVar36._0_4_ + local_260 * auVar31._0_4_ + fVar184 * auVar35._0_4_) *
              (fVar111 + fVar111 * auVar32._0_4_);
  fStack_3dc = (local_240 * auVar36._4_4_ + local_260 * auVar31._4_4_ + fVar184 * auVar35._4_4_) *
               (fVar117 + fVar117 * auVar32._4_4_);
  fStack_3d8 = (local_240 * auVar36._8_4_ + local_260 * auVar31._8_4_ + fVar184 * auVar35._8_4_) *
               (fVar118 + fVar118 * auVar32._8_4_);
  fStack_3d4 = (local_240 * auVar36._12_4_ + local_260 * auVar31._12_4_ + fVar184 * auVar35._12_4_)
               * (fVar119 + fVar119 * auVar32._12_4_);
  fStack_3d0 = (local_240 * auVar36._16_4_ + local_260 * auVar31._16_4_ + fVar184 * auVar35._16_4_)
               * (fVar120 + fVar120 * auVar32._16_4_);
  fStack_3cc = (local_240 * auVar36._20_4_ + local_260 * auVar31._20_4_ + fVar184 * auVar35._20_4_)
               * (fVar121 + fVar121 * auVar32._20_4_);
  fStack_3c8 = (local_240 * auVar36._24_4_ + local_260 * auVar31._24_4_ + fVar184 * auVar35._24_4_)
               * (fVar122 + fVar122 * auVar32._24_4_);
  auVar188._0_4_ = fVar187 + local_240 * local_3e0;
  auVar188._4_4_ = fVar187 + local_240 * fStack_3dc;
  auVar188._8_4_ = fVar187 + local_240 * fStack_3d8;
  auVar188._12_4_ = fVar187 + local_240 * fStack_3d4;
  auVar188._16_4_ = fVar187 + local_240 * fStack_3d0;
  auVar188._20_4_ = fVar187 + local_240 * fStack_3cc;
  auVar188._24_4_ = fVar187 + local_240 * fStack_3c8;
  auVar188._28_4_ = fVar187 + fVar97;
  auVar130._0_4_ = fVar172 + local_260 * local_3e0;
  auVar130._4_4_ = fVar172 + local_260 * fStack_3dc;
  auVar130._8_4_ = fVar172 + local_260 * fStack_3d8;
  auVar130._12_4_ = fVar172 + local_260 * fStack_3d4;
  auVar130._16_4_ = fVar172 + local_260 * fStack_3d0;
  auVar130._20_4_ = fVar172 + local_260 * fStack_3cc;
  auVar130._24_4_ = fVar172 + local_260 * fStack_3c8;
  auVar130._28_4_ = fVar172 + fVar97;
  auVar115._0_4_ = fVar186 + fVar184 * local_3e0;
  auVar115._4_4_ = fVar186 + fVar184 * fStack_3dc;
  auVar115._8_4_ = fVar186 + fVar184 * fStack_3d8;
  auVar115._12_4_ = fVar186 + fVar184 * fStack_3d4;
  auVar115._16_4_ = fVar186 + fVar184 * fStack_3d0;
  auVar115._20_4_ = fVar186 + fVar184 * fStack_3cc;
  auVar115._24_4_ = fVar186 + fVar184 * fStack_3c8;
  auVar115._28_4_ = fVar186 + fVar97;
  local_360 = vsubps_avx(auVar86,auVar33);
  local_380 = vsubps_avx(auVar101,auVar38);
  fVar172 = local_380._0_4_;
  fVar119 = local_380._4_4_;
  fVar196 = local_380._8_4_;
  fVar11 = local_380._12_4_;
  fVar16 = local_380._16_4_;
  fVar21 = local_380._20_4_;
  fVar26 = local_380._24_4_;
  fVar186 = local_360._0_4_;
  fVar120 = local_360._4_4_;
  fVar198 = local_360._8_4_;
  fVar12 = local_360._12_4_;
  fVar17 = local_360._16_4_;
  fVar22 = local_360._20_4_;
  fVar27 = local_360._24_4_;
  fVar147 = fStack_3e4 + auVar86._28_4_;
  local_3c0 = vsubps_avx(auVar100,auVar37);
  fVar187 = local_3c0._0_4_;
  fVar121 = local_3c0._4_4_;
  fVar200 = local_3c0._8_4_;
  fVar13 = local_3c0._12_4_;
  fVar18 = local_3c0._16_4_;
  fVar23 = local_3c0._20_4_;
  fVar28 = local_3c0._24_4_;
  local_400._0_4_ = fVar187 * fVar187 + fVar186 * fVar186 + fVar172 * fVar172;
  local_400._4_4_ = fVar121 * fVar121 + fVar120 * fVar120 + fVar119 * fVar119;
  fStack_3f8 = fVar200 * fVar200 + fVar198 * fVar198 + fVar196 * fVar196;
  fStack_3f4 = fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11;
  fStack_3f0 = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
  fStack_3ec = fVar23 * fVar23 + fVar22 * fVar22 + fVar21 * fVar21;
  fStack_3e8 = fVar28 * fVar28 + fVar27 * fVar27 + fVar26 * fVar26;
  fStack_3e4 = fStack_3e4 + fVar147;
  _local_5e0 = vsubps_avx(auVar130,auVar33);
  local_3a0 = vsubps_avx(auVar115,auVar38);
  fVar97 = local_3a0._0_4_;
  fVar122 = local_3a0._4_4_;
  fVar202 = local_3a0._8_4_;
  fVar14 = local_3a0._12_4_;
  fVar19 = local_3a0._16_4_;
  fVar24 = local_3a0._20_4_;
  fVar29 = local_3a0._24_4_;
  fVar111 = local_5e0._0_4_;
  fVar166 = local_5e0._4_4_;
  fVar167 = local_5e0._8_4_;
  fVar168 = local_5e0._12_4_;
  fVar169 = local_5e0._16_4_;
  fVar170 = local_5e0._20_4_;
  fVar171 = local_5e0._24_4_;
  _local_5a0 = vsubps_avx(auVar188,auVar37);
  fVar117 = local_5a0._0_4_;
  fVar207 = local_5a0._4_4_;
  fVar208 = local_5a0._8_4_;
  fVar209 = local_5a0._12_4_;
  fVar210 = local_5a0._16_4_;
  fVar211 = local_5a0._20_4_;
  fVar212 = local_5a0._24_4_;
  fVar192 = fVar187 * fVar117 + fVar186 * fVar111 + fVar172 * fVar97;
  fVar193 = fVar121 * fVar207 + fVar120 * fVar166 + fVar119 * fVar122;
  fVar195 = fVar200 * fVar208 + fVar198 * fVar167 + fVar196 * fVar202;
  fVar197 = fVar13 * fVar209 + fVar12 * fVar168 + fVar11 * fVar14;
  fVar199 = fVar18 * fVar210 + fVar17 * fVar169 + fVar16 * fVar19;
  fVar201 = fVar23 * fVar211 + fVar22 * fVar170 + fVar21 * fVar24;
  fVar203 = fVar28 * fVar212 + fVar27 * fVar171 + fVar26 * fVar29;
  fVar205 = auVar130._28_4_ + fVar147 + auVar115._28_4_;
  fVar123 = auVar130._28_4_ + fVar147 + auVar115._28_4_;
  auVar189._0_4_ = fVar187 * local_240 + local_260 * fVar186 + fVar172 * fVar184;
  auVar189._4_4_ = fVar121 * local_240 + local_260 * fVar120 + fVar119 * fVar184;
  auVar189._8_4_ = fVar200 * local_240 + local_260 * fVar198 + fVar196 * fVar184;
  auVar189._12_4_ = fVar13 * local_240 + local_260 * fVar12 + fVar11 * fVar184;
  auVar189._16_4_ = fVar18 * local_240 + local_260 * fVar17 + fVar16 * fVar184;
  auVar189._20_4_ = fVar23 * local_240 + local_260 * fVar22 + fVar21 * fVar184;
  auVar189._24_4_ = fVar28 * local_240 + local_260 * fVar27 + fVar26 * fVar184;
  auVar189._28_4_ = auVar130._28_4_ + fVar123;
  fVar143 = fVar147 + auVar130._28_4_;
  auVar31 = vsubps_avx(auVar34,auVar87);
  fVar118 = auVar31._0_4_;
  fVar194 = auVar31._4_4_;
  fVar204 = auVar31._8_4_;
  fVar15 = auVar31._12_4_;
  fVar20 = auVar31._16_4_;
  fVar25 = auVar31._20_4_;
  fVar30 = auVar31._24_4_;
  local_2e0 = fVar118 * fVar118 + (float)local_400._0_4_;
  fStack_2dc = fVar194 * fVar194 + (float)local_400._4_4_;
  fStack_2d8 = fVar204 * fVar204 + fStack_3f8;
  fStack_2d4 = fVar15 * fVar15 + fStack_3f4;
  fStack_2d0 = fVar20 * fVar20 + fStack_3f0;
  fStack_2cc = fVar25 * fVar25 + fStack_3ec;
  fStack_2c8 = fVar30 * fVar30 + fStack_3e8;
  fStack_2c4 = fVar143 + fStack_3e4;
  fVar129 = (float)local_400._0_4_ * (float)local_400._0_4_;
  fVar137 = (float)local_400._4_4_ * (float)local_400._4_4_;
  local_140._4_4_ = fVar137;
  local_140._0_4_ = fVar129;
  fVar138 = fStack_3f8 * fStack_3f8;
  fStack_138 = fVar138;
  fVar139 = fStack_3f4 * fStack_3f4;
  fStack_134 = fVar139;
  fVar140 = fStack_3f0 * fStack_3f0;
  fStack_130 = fVar140;
  fVar141 = fStack_3ec * fStack_3ec;
  fStack_12c = fVar141;
  fVar142 = fStack_3e8 * fStack_3e8;
  fStack_128 = fVar142;
  uStack_124 = fVar143;
  auVar33._4_4_ = fVar137 * (local_240 * fVar207 + local_260 * fVar166 + fVar184 * fVar122);
  auVar33._0_4_ = fVar129 * (local_240 * fVar117 + local_260 * fVar111 + fVar184 * fVar97);
  auVar33._8_4_ = fVar138 * (local_240 * fVar208 + local_260 * fVar167 + fVar184 * fVar202);
  auVar33._12_4_ = fVar139 * (local_240 * fVar209 + local_260 * fVar168 + fVar184 * fVar14);
  auVar33._16_4_ = fVar140 * (local_240 * fVar210 + local_260 * fVar169 + fVar184 * fVar19);
  auVar33._20_4_ = fVar141 * (local_240 * fVar211 + local_260 * fVar170 + fVar184 * fVar24);
  auVar33._24_4_ = fVar142 * (local_240 * fVar212 + local_260 * fVar171 + fVar184 * fVar29);
  auVar33._28_4_ = auVar130._28_4_ + auVar130._28_4_ + fVar123;
  fVar123 = local_360._28_4_;
  auVar37._4_4_ = fStack_2dc * auVar189._4_4_ * fVar193;
  auVar37._0_4_ = local_2e0 * auVar189._0_4_ * fVar192;
  auVar37._8_4_ = fStack_2d8 * auVar189._8_4_ * fVar195;
  auVar37._12_4_ = fStack_2d4 * auVar189._12_4_ * fVar197;
  auVar37._16_4_ = fStack_2d0 * auVar189._16_4_ * fVar199;
  auVar37._20_4_ = fStack_2cc * auVar189._20_4_ * fVar201;
  auVar37._24_4_ = fStack_2c8 * auVar189._24_4_ * fVar203;
  auVar37._28_4_ = fVar123;
  auVar32 = vsubps_avx(auVar33,auVar37);
  fVar149 = auVar34._0_4_;
  fVar173 = fVar149 * (float)local_400._0_4_;
  fVar155 = auVar34._4_4_;
  fVar178 = fVar155 * (float)local_400._4_4_;
  auVar38._4_4_ = fVar178;
  auVar38._0_4_ = fVar173;
  fVar156 = auVar34._8_4_;
  fVar179 = fVar156 * fStack_3f8;
  auVar38._8_4_ = fVar179;
  fVar157 = auVar34._12_4_;
  fVar180 = fVar157 * fStack_3f4;
  auVar38._12_4_ = fVar180;
  fVar158 = auVar34._16_4_;
  fVar181 = fVar158 * fStack_3f0;
  auVar38._16_4_ = fVar181;
  fVar159 = auVar34._20_4_;
  fVar182 = fVar159 * fStack_3ec;
  auVar38._20_4_ = fVar182;
  fVar160 = auVar34._24_4_;
  uVar82 = local_3c0._28_4_;
  fVar183 = fVar160 * fStack_3e8;
  auVar38._24_4_ = fVar183;
  auVar38._28_4_ = uVar82;
  auVar151._0_4_ = fVar173 * auVar189._0_4_ * fVar118 + auVar32._0_4_;
  auVar151._4_4_ = fVar178 * auVar189._4_4_ * fVar194 + auVar32._4_4_;
  auVar151._8_4_ = fVar179 * auVar189._8_4_ * fVar204 + auVar32._8_4_;
  auVar151._12_4_ = fVar180 * auVar189._12_4_ * fVar15 + auVar32._12_4_;
  auVar151._16_4_ = fVar181 * auVar189._16_4_ * fVar20 + auVar32._16_4_;
  auVar151._20_4_ = fVar182 * auVar189._20_4_ * fVar25 + auVar32._20_4_;
  auVar151._24_4_ = fVar183 * auVar189._24_4_ * fVar30 + auVar32._24_4_;
  auVar151._28_4_ = fVar123 + auVar32._28_4_;
  auVar34._4_4_ = (fVar207 * fVar207 + fVar166 * fVar166 + fVar122 * fVar122) * fVar137;
  auVar34._0_4_ = (fVar117 * fVar117 + fVar111 * fVar111 + fVar97 * fVar97) * fVar129;
  auVar34._8_4_ = (fVar208 * fVar208 + fVar167 * fVar167 + fVar202 * fVar202) * fVar138;
  auVar34._12_4_ = (fVar209 * fVar209 + fVar168 * fVar168 + fVar14 * fVar14) * fVar139;
  auVar34._16_4_ = (fVar210 * fVar210 + fVar169 * fVar169 + fVar19 * fVar19) * fVar140;
  auVar34._20_4_ = (fVar211 * fVar211 + fVar170 * fVar170 + fVar24 * fVar24) * fVar141;
  auVar34._24_4_ = (fVar212 * fVar212 + fVar171 * fVar171 + fVar29 * fVar29) * fVar142;
  auVar34._28_4_ = auVar32._28_4_;
  auVar39._4_4_ = fVar193 * fVar193 * fStack_2dc;
  auVar39._0_4_ = fVar192 * fVar192 * local_2e0;
  auVar39._8_4_ = fVar195 * fVar195 * fStack_2d8;
  auVar39._12_4_ = fVar197 * fVar197 * fStack_2d4;
  auVar39._16_4_ = fVar199 * fVar199 * fStack_2d0;
  auVar39._20_4_ = fVar201 * fVar201 * fStack_2cc;
  auVar39._24_4_ = fVar203 * fVar203 * fStack_2c8;
  auVar39._28_4_ = fVar147 + fVar143;
  auVar32 = vsubps_avx(auVar34,auVar39);
  auVar40._4_4_ = (fVar194 + fVar194) * fVar193;
  auVar40._0_4_ = (fVar118 + fVar118) * fVar192;
  auVar40._8_4_ = (fVar204 + fVar204) * fVar195;
  auVar40._12_4_ = (fVar15 + fVar15) * fVar197;
  auVar40._16_4_ = (fVar20 + fVar20) * fVar199;
  auVar40._20_4_ = (fVar25 + fVar25) * fVar201;
  auVar40._24_4_ = (fVar30 + fVar30) * fVar203;
  auVar40._28_4_ = auVar31._28_4_ + auVar31._28_4_;
  auVar31 = vsubps_avx(auVar40,auVar38);
  fVar147 = auVar189._0_4_ * auVar189._0_4_;
  fVar91 = auVar189._4_4_ * auVar189._4_4_;
  fVar92 = auVar189._8_4_ * auVar189._8_4_;
  fVar93 = auVar189._12_4_ * auVar189._12_4_;
  fVar94 = auVar189._16_4_ * auVar189._16_4_;
  fVar95 = auVar189._20_4_ * auVar189._20_4_;
  fVar96 = auVar189._24_4_ * auVar189._24_4_;
  auVar41._4_4_ = fStack_2dc * fVar91;
  auVar41._0_4_ = local_2e0 * fVar147;
  auVar41._8_4_ = fStack_2d8 * fVar92;
  auVar41._12_4_ = fStack_2d4 * fVar93;
  auVar41._16_4_ = fStack_2d0 * fVar94;
  auVar41._20_4_ = fStack_2cc * fVar95;
  auVar41._24_4_ = fStack_2c8 * fVar96;
  auVar41._28_4_ = auVar31._28_4_;
  auVar35 = vsubps_avx(_local_140,auVar41);
  auVar42._4_4_ = auVar35._4_4_ * (fVar178 * auVar31._4_4_ + auVar32._4_4_);
  auVar42._0_4_ = auVar35._0_4_ * (fVar173 * auVar31._0_4_ + auVar32._0_4_);
  auVar42._8_4_ = auVar35._8_4_ * (fVar179 * auVar31._8_4_ + auVar32._8_4_);
  auVar42._12_4_ = auVar35._12_4_ * (fVar180 * auVar31._12_4_ + auVar32._12_4_);
  auVar42._16_4_ = auVar35._16_4_ * (fVar181 * auVar31._16_4_ + auVar32._16_4_);
  auVar42._20_4_ = auVar35._20_4_ * (fVar182 * auVar31._20_4_ + auVar32._20_4_);
  auVar42._24_4_ = auVar35._24_4_ * (fVar183 * auVar31._24_4_ + auVar32._24_4_);
  auVar42._28_4_ = auVar31._28_4_ + auVar32._28_4_;
  auVar43._4_4_ = auVar151._4_4_ * auVar151._4_4_;
  auVar43._0_4_ = auVar151._0_4_ * auVar151._0_4_;
  auVar43._8_4_ = auVar151._8_4_ * auVar151._8_4_;
  auVar43._12_4_ = auVar151._12_4_ * auVar151._12_4_;
  auVar43._16_4_ = auVar151._16_4_ * auVar151._16_4_;
  auVar43._20_4_ = auVar151._20_4_ * auVar151._20_4_;
  auVar43._24_4_ = auVar151._24_4_ * auVar151._24_4_;
  auVar43._28_4_ = uVar82;
  auVar32 = vsubps_avx(auVar43,auVar42);
  auVar31 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,5);
  auVar36 = auVar31 & ~auVar88;
  if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar36 >> 0x7f,0) != '\0') ||
        (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar36 >> 0xbf,0) != '\0') ||
      (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar36[0x1f] < '\0') {
    auVar36 = vandnps_avx(auVar88,auVar31);
    auVar37 = vsubps_avx(auVar188,auVar100);
    auVar86 = vsubps_avx(auVar130,auVar86);
    auVar38 = vsubps_avx(auVar115,auVar101);
    fVar98 = auVar37._0_4_ * fVar187 + auVar86._0_4_ * fVar186 + auVar38._0_4_ * fVar172;
    fVar105 = auVar37._4_4_ * fVar121 + auVar86._4_4_ * fVar120 + auVar38._4_4_ * fVar119;
    fVar106 = auVar37._8_4_ * fVar200 + auVar86._8_4_ * fVar198 + auVar38._8_4_ * fVar196;
    fVar107 = auVar37._12_4_ * fVar13 + auVar86._12_4_ * fVar12 + auVar38._12_4_ * fVar11;
    fVar108 = auVar37._16_4_ * fVar18 + auVar86._16_4_ * fVar17 + auVar38._16_4_ * fVar16;
    fVar109 = auVar37._20_4_ * fVar23 + auVar86._20_4_ * fVar22 + auVar38._20_4_ * fVar21;
    fVar110 = auVar37._24_4_ * fVar28 + auVar86._24_4_ * fVar27 + auVar38._24_4_ * fVar26;
    auVar32 = vsqrtps_avx(auVar32);
    auVar31 = vrcpps_avx(auVar35);
    fVar173 = auVar31._0_4_;
    auVar144._0_4_ = auVar35._0_4_ * fVar173;
    fVar178 = auVar31._4_4_;
    auVar144._4_4_ = auVar35._4_4_ * fVar178;
    fVar179 = auVar31._8_4_;
    auVar144._8_4_ = auVar35._8_4_ * fVar179;
    fVar180 = auVar31._12_4_;
    auVar144._12_4_ = auVar35._12_4_ * fVar180;
    fVar181 = auVar31._16_4_;
    auVar144._16_4_ = auVar35._16_4_ * fVar181;
    fVar182 = auVar31._20_4_;
    auVar144._20_4_ = auVar35._20_4_ * fVar182;
    fVar183 = auVar31._24_4_;
    auVar144._24_4_ = auVar35._24_4_ * fVar183;
    auVar144._28_4_ = 0;
    auVar131._8_4_ = 0x3f800000;
    auVar131._0_8_ = &DAT_3f8000003f800000;
    auVar131._12_4_ = 0x3f800000;
    auVar131._16_4_ = 0x3f800000;
    auVar131._20_4_ = 0x3f800000;
    auVar131._24_4_ = 0x3f800000;
    auVar131._28_4_ = 0x3f800000;
    auVar33 = vsubps_avx(auVar131,auVar144);
    auVar116._8_4_ = 0x7fffffff;
    auVar116._0_8_ = 0x7fffffff7fffffff;
    auVar116._12_4_ = 0x7fffffff;
    auVar116._16_4_ = 0x7fffffff;
    auVar116._20_4_ = 0x7fffffff;
    auVar116._24_4_ = 0x7fffffff;
    auVar116._28_4_ = 0x7fffffff;
    fVar173 = fVar173 + fVar173 * auVar33._0_4_;
    fVar178 = fVar178 + fVar178 * auVar33._4_4_;
    fVar179 = fVar179 + fVar179 * auVar33._8_4_;
    fVar180 = fVar180 + fVar180 * auVar33._12_4_;
    fVar181 = fVar181 + fVar181 * auVar33._16_4_;
    fVar182 = fVar182 + fVar182 * auVar33._20_4_;
    fVar183 = fVar183 + fVar183 * auVar33._24_4_;
    fVar148 = auVar31._28_4_ + auVar33._28_4_;
    auVar31 = vandps_avx(auVar35,auVar116);
    auVar163._8_4_ = 0x219392ef;
    auVar163._0_8_ = 0x219392ef219392ef;
    auVar163._12_4_ = 0x219392ef;
    auVar163._16_4_ = 0x219392ef;
    auVar163._20_4_ = 0x219392ef;
    auVar163._24_4_ = 0x219392ef;
    auVar163._28_4_ = 0x219392ef;
    auVar31 = vcmpps_avx(auVar31,auVar163,2);
    uVar81 = CONCAT44(auVar151._4_4_,auVar151._0_4_);
    auVar164._0_8_ = uVar81 ^ 0x8000000080000000;
    auVar164._8_4_ = -auVar151._8_4_;
    auVar164._12_4_ = -auVar151._12_4_;
    auVar164._16_4_ = -auVar151._16_4_;
    auVar164._20_4_ = -auVar151._20_4_;
    auVar164._24_4_ = -auVar151._24_4_;
    auVar164._28_4_ = -auVar151._28_4_;
    auVar35 = vsubps_avx(auVar164,auVar32);
    auVar32 = vsubps_avx(auVar32,auVar151);
    auVar44._4_4_ = auVar35._4_4_ * fVar178;
    auVar44._0_4_ = auVar35._0_4_ * fVar173;
    auVar44._8_4_ = auVar35._8_4_ * fVar179;
    auVar44._12_4_ = auVar35._12_4_ * fVar180;
    auVar44._16_4_ = auVar35._16_4_ * fVar181;
    auVar44._20_4_ = auVar35._20_4_ * fVar182;
    auVar44._24_4_ = auVar35._24_4_ * fVar183;
    auVar44._28_4_ = auVar35._28_4_;
    auVar45._4_4_ = auVar32._4_4_ * fVar178;
    auVar45._0_4_ = auVar32._0_4_ * fVar173;
    auVar45._8_4_ = auVar32._8_4_ * fVar179;
    auVar45._12_4_ = auVar32._12_4_ * fVar180;
    auVar45._16_4_ = auVar32._16_4_ * fVar181;
    auVar45._20_4_ = auVar32._20_4_ * fVar182;
    auVar45._24_4_ = auVar32._24_4_ * fVar183;
    auVar45._28_4_ = fVar148;
    auVar102._8_4_ = 0xff800000;
    auVar102._0_8_ = 0xff800000ff800000;
    auVar102._12_4_ = 0xff800000;
    auVar102._16_4_ = 0xff800000;
    auVar102._20_4_ = 0xff800000;
    auVar102._24_4_ = 0xff800000;
    auVar102._28_4_ = 0xff800000;
    auVar32 = vblendvps_avx(auVar44,auVar102,auVar31);
    auVar213._8_4_ = 0x7f800000;
    auVar213._0_8_ = 0x7f8000007f800000;
    auVar213._12_4_ = 0x7f800000;
    auVar213._16_4_ = 0x7f800000;
    auVar213._20_4_ = 0x7f800000;
    auVar213._24_4_ = 0x7f800000;
    auVar213._28_4_ = 0x7f800000;
    auVar35 = vblendvps_avx(auVar45,auVar213,auVar31);
    auVar126._0_4_ = fVar192 + auVar189._0_4_ * auVar32._0_4_;
    auVar126._4_4_ = fVar193 + auVar189._4_4_ * auVar32._4_4_;
    auVar126._8_4_ = fVar195 + auVar189._8_4_ * auVar32._8_4_;
    auVar126._12_4_ = fVar197 + auVar189._12_4_ * auVar32._12_4_;
    auVar126._16_4_ = fVar199 + auVar189._16_4_ * auVar32._16_4_;
    auVar126._20_4_ = fVar201 + auVar189._20_4_ * auVar32._20_4_;
    auVar126._24_4_ = fVar203 + auVar189._24_4_ * auVar32._24_4_;
    auVar126._28_4_ = fVar205 + fVar148;
    auVar31 = vcmpps_avx(auVar126,ZEXT432(0) << 0x20,6);
    auVar34 = vcmpps_avx(auVar126,_local_400,1);
    auVar31 = vandps_avx(auVar34,auVar31);
    auVar31 = vandps_avx(auVar36,auVar31);
    auVar33 = vblendvps_avx(auVar213,auVar32,auVar31);
    local_460._0_4_ = fVar192 + auVar189._0_4_ * auVar35._0_4_;
    local_460._4_4_ = fVar193 + auVar189._4_4_ * auVar35._4_4_;
    fStack_458 = fVar195 + auVar189._8_4_ * auVar35._8_4_;
    fStack_454 = fVar197 + auVar189._12_4_ * auVar35._12_4_;
    fStack_450 = fVar199 + auVar189._16_4_ * auVar35._16_4_;
    fStack_44c = fVar201 + auVar189._20_4_ * auVar35._20_4_;
    fStack_448 = fVar203 + auVar189._24_4_ * auVar35._24_4_;
    register0x000012dc = fVar205 + auVar31._28_4_;
    auVar31 = vcmpps_avx(_local_460,ZEXT432(0) << 0x20,6);
    auVar32 = vcmpps_avx(_local_460,_local_400,1);
    auVar31 = vandps_avx(auVar32,auVar31);
    auVar31 = vandps_avx(auVar36,auVar31);
    local_440 = vblendvps_avx(auVar102,auVar35,auVar31);
    auVar35 = vrcpps_avx(auVar189);
    fVar173 = auVar35._0_4_;
    fVar178 = auVar35._4_4_;
    auVar46._4_4_ = auVar189._4_4_ * fVar178;
    auVar46._0_4_ = auVar189._0_4_ * fVar173;
    fVar179 = auVar35._8_4_;
    auVar46._8_4_ = auVar189._8_4_ * fVar179;
    fVar180 = auVar35._12_4_;
    auVar46._12_4_ = auVar189._12_4_ * fVar180;
    fVar181 = auVar35._16_4_;
    auVar46._16_4_ = auVar189._16_4_ * fVar181;
    fVar182 = auVar35._20_4_;
    auVar46._20_4_ = auVar189._20_4_ * fVar182;
    fVar183 = auVar35._24_4_;
    auVar46._24_4_ = auVar189._24_4_ * fVar183;
    auVar46._28_4_ = auVar31._28_4_;
    auVar31 = vsubps_avx(auVar131,auVar46);
    fVar173 = fVar173 + fVar173 * auVar31._0_4_;
    fVar178 = fVar178 + fVar178 * auVar31._4_4_;
    fVar179 = fVar179 + fVar179 * auVar31._8_4_;
    fVar180 = fVar180 + fVar180 * auVar31._12_4_;
    fVar181 = fVar181 + fVar181 * auVar31._16_4_;
    fVar182 = fVar182 + fVar182 * auVar31._20_4_;
    fVar183 = fVar183 + fVar183 * auVar31._24_4_;
    auVar47._4_4_ = auVar189._4_4_ * fVar207;
    auVar47._0_4_ = auVar189._0_4_ * fVar117;
    auVar47._8_4_ = auVar189._8_4_ * fVar208;
    auVar47._12_4_ = auVar189._12_4_ * fVar209;
    auVar47._16_4_ = auVar189._16_4_ * fVar210;
    auVar47._20_4_ = auVar189._20_4_ * fVar211;
    auVar47._24_4_ = auVar189._24_4_ * fVar212;
    auVar47._28_4_ = auVar31._28_4_;
    auVar48._4_4_ = fVar193 * local_240;
    auVar48._0_4_ = fVar192 * local_240;
    auVar48._8_4_ = fVar195 * local_240;
    auVar48._12_4_ = fVar197 * local_240;
    auVar48._16_4_ = fVar199 * local_240;
    auVar48._20_4_ = fVar201 * local_240;
    auVar48._24_4_ = fVar203 * local_240;
    auVar48._28_4_ = auVar32._28_4_;
    auVar31 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = auVar189._4_4_ * fVar166;
    auVar49._0_4_ = auVar189._0_4_ * fVar111;
    auVar49._8_4_ = auVar189._8_4_ * fVar167;
    auVar49._12_4_ = auVar189._12_4_ * fVar168;
    auVar49._16_4_ = auVar189._16_4_ * fVar169;
    auVar49._20_4_ = auVar189._20_4_ * fVar170;
    auVar49._24_4_ = auVar189._24_4_ * fVar171;
    auVar49._28_4_ = auVar32._28_4_;
    auVar50._4_4_ = fVar193 * local_260;
    auVar50._0_4_ = fVar192 * local_260;
    auVar50._8_4_ = fVar195 * local_260;
    auVar50._12_4_ = fVar197 * local_260;
    auVar50._16_4_ = fVar199 * local_260;
    auVar50._20_4_ = fVar201 * local_260;
    auVar50._24_4_ = fVar203 * local_260;
    auVar50._28_4_ = auVar34._28_4_;
    auVar32 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = auVar189._4_4_ * fVar122;
    auVar51._0_4_ = auVar189._0_4_ * fVar97;
    auVar51._8_4_ = auVar189._8_4_ * fVar202;
    auVar51._12_4_ = auVar189._12_4_ * fVar14;
    auVar51._16_4_ = auVar189._16_4_ * fVar19;
    auVar51._20_4_ = auVar189._20_4_ * fVar24;
    auVar51._24_4_ = auVar189._24_4_ * fVar29;
    auVar51._28_4_ = auVar34._28_4_;
    auVar52._4_4_ = fVar184 * fVar193;
    auVar52._0_4_ = fVar184 * fVar192;
    auVar52._8_4_ = fVar184 * fVar195;
    auVar52._12_4_ = fVar184 * fVar197;
    auVar52._16_4_ = fVar184 * fVar199;
    auVar52._20_4_ = fVar184 * fVar201;
    auVar52._24_4_ = fVar184 * fVar203;
    auVar52._28_4_ = 0x3f800000;
    auVar35 = vsubps_avx(auVar51,auVar52);
    auVar132._0_4_ =
         auVar31._0_4_ * auVar31._0_4_ +
         auVar32._0_4_ * auVar32._0_4_ + auVar35._0_4_ * auVar35._0_4_;
    auVar132._4_4_ =
         auVar31._4_4_ * auVar31._4_4_ +
         auVar32._4_4_ * auVar32._4_4_ + auVar35._4_4_ * auVar35._4_4_;
    auVar132._8_4_ =
         auVar31._8_4_ * auVar31._8_4_ +
         auVar32._8_4_ * auVar32._8_4_ + auVar35._8_4_ * auVar35._8_4_;
    auVar132._12_4_ =
         auVar31._12_4_ * auVar31._12_4_ +
         auVar32._12_4_ * auVar32._12_4_ + auVar35._12_4_ * auVar35._12_4_;
    auVar132._16_4_ =
         auVar31._16_4_ * auVar31._16_4_ +
         auVar32._16_4_ * auVar32._16_4_ + auVar35._16_4_ * auVar35._16_4_;
    auVar132._20_4_ =
         auVar31._20_4_ * auVar31._20_4_ +
         auVar32._20_4_ * auVar32._20_4_ + auVar35._20_4_ * auVar35._20_4_;
    auVar132._24_4_ =
         auVar31._24_4_ * auVar31._24_4_ +
         auVar32._24_4_ * auVar32._24_4_ + auVar35._24_4_ * auVar35._24_4_;
    auVar132._28_4_ = auVar31._28_4_ + auVar32._28_4_ + auVar35._28_4_;
    auVar53._4_4_ = fVar155 * fVar155 * fVar91;
    auVar53._0_4_ = fVar149 * fVar149 * fVar147;
    auVar53._8_4_ = fVar156 * fVar156 * fVar92;
    auVar53._12_4_ = fVar157 * fVar157 * fVar93;
    auVar53._16_4_ = fVar158 * fVar158 * fVar94;
    auVar53._20_4_ = fVar159 * fVar159 * fVar95;
    auVar53._24_4_ = fVar160 * fVar160 * fVar96;
    auVar53._28_4_ = auVar31._28_4_;
    auVar31 = vcmpps_avx(auVar132,auVar53,1);
    auVar54._4_4_ = fVar178 * -fVar193;
    auVar54._0_4_ = fVar173 * -fVar192;
    auVar54._8_4_ = fVar179 * -fVar195;
    auVar54._12_4_ = fVar180 * -fVar197;
    auVar54._16_4_ = fVar181 * -fVar199;
    auVar54._20_4_ = fVar182 * -fVar201;
    auVar54._24_4_ = fVar183 * -fVar203;
    auVar54._28_4_ = -fVar205;
    auVar32 = vblendvps_avx(auVar213,auVar54,auVar31);
    auVar145._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar145._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar31 = vandnps_avx(auVar145,auVar36);
    local_280 = vblendvps_avx(auVar213,auVar32,auVar31);
    auVar133._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar133._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar127._0_4_ = auVar189._0_4_ * auVar37._0_4_;
    auVar127._4_4_ = auVar189._4_4_ * auVar37._4_4_;
    auVar127._8_4_ = auVar189._8_4_ * auVar37._8_4_;
    auVar127._12_4_ = auVar189._12_4_ * auVar37._12_4_;
    auVar127._16_4_ = auVar189._16_4_ * auVar37._16_4_;
    auVar127._20_4_ = auVar189._20_4_ * auVar37._20_4_;
    auVar127._24_4_ = auVar189._24_4_ * auVar37._24_4_;
    auVar127._28_4_ = 0;
    auVar55._4_4_ = auVar189._4_4_ * auVar86._4_4_;
    auVar55._0_4_ = auVar189._0_4_ * auVar86._0_4_;
    auVar55._8_4_ = auVar189._8_4_ * auVar86._8_4_;
    auVar55._12_4_ = auVar189._12_4_ * auVar86._12_4_;
    auVar55._16_4_ = auVar189._16_4_ * auVar86._16_4_;
    auVar55._20_4_ = auVar189._20_4_ * auVar86._20_4_;
    auVar55._24_4_ = auVar189._24_4_ * auVar86._24_4_;
    auVar55._28_4_ = fStack_3e4;
    auVar56._4_4_ = auVar189._4_4_ * auVar38._4_4_;
    auVar56._0_4_ = auVar189._0_4_ * auVar38._0_4_;
    auVar56._8_4_ = auVar189._8_4_ * auVar38._8_4_;
    auVar56._12_4_ = auVar189._12_4_ * auVar38._12_4_;
    auVar56._16_4_ = auVar189._16_4_ * auVar38._16_4_;
    auVar56._20_4_ = auVar189._20_4_ * auVar38._20_4_;
    auVar56._24_4_ = auVar189._24_4_ * auVar38._24_4_;
    auVar56._28_4_ = 0;
    auVar57._4_4_ = fVar105 * local_240;
    auVar57._0_4_ = fVar98 * local_240;
    auVar57._8_4_ = fVar106 * local_240;
    auVar57._12_4_ = fVar107 * local_240;
    auVar57._16_4_ = fVar108 * local_240;
    auVar57._20_4_ = fVar109 * local_240;
    uVar80 = auVar31._28_4_;
    auVar57._24_4_ = fVar110 * local_240;
    auVar57._28_4_ = uVar80;
    auVar31 = vsubps_avx(auVar127,auVar57);
    auVar58._4_4_ = fVar105 * local_260;
    auVar58._0_4_ = fVar98 * local_260;
    auVar58._8_4_ = fVar106 * local_260;
    auVar58._12_4_ = fVar107 * local_260;
    auVar58._16_4_ = fVar108 * local_260;
    auVar58._20_4_ = fVar109 * local_260;
    auVar58._24_4_ = fVar110 * local_260;
    auVar58._28_4_ = uVar80;
    auVar32 = vsubps_avx(auVar55,auVar58);
    auVar59._4_4_ = fVar184 * fVar105;
    auVar59._0_4_ = fVar184 * fVar98;
    auVar59._8_4_ = fVar184 * fVar106;
    auVar59._12_4_ = fVar184 * fVar107;
    auVar59._16_4_ = fVar184 * fVar108;
    auVar59._20_4_ = fVar184 * fVar109;
    auVar59._24_4_ = fVar184 * fVar110;
    auVar59._28_4_ = uVar80;
    auVar35 = vsubps_avx(auVar56,auVar59);
    auVar90._0_4_ =
         auVar31._0_4_ * auVar31._0_4_ +
         auVar32._0_4_ * auVar32._0_4_ + auVar35._0_4_ * auVar35._0_4_;
    auVar90._4_4_ =
         auVar31._4_4_ * auVar31._4_4_ +
         auVar32._4_4_ * auVar32._4_4_ + auVar35._4_4_ * auVar35._4_4_;
    auVar90._8_4_ =
         auVar31._8_4_ * auVar31._8_4_ +
         auVar32._8_4_ * auVar32._8_4_ + auVar35._8_4_ * auVar35._8_4_;
    auVar90._12_4_ =
         auVar31._12_4_ * auVar31._12_4_ +
         auVar32._12_4_ * auVar32._12_4_ + auVar35._12_4_ * auVar35._12_4_;
    auVar90._16_4_ =
         auVar31._16_4_ * auVar31._16_4_ +
         auVar32._16_4_ * auVar32._16_4_ + auVar35._16_4_ * auVar35._16_4_;
    auVar90._20_4_ =
         auVar31._20_4_ * auVar31._20_4_ +
         auVar32._20_4_ * auVar32._20_4_ + auVar35._20_4_ * auVar35._20_4_;
    auVar90._24_4_ =
         auVar31._24_4_ * auVar31._24_4_ +
         auVar32._24_4_ * auVar32._24_4_ + auVar35._24_4_ * auVar35._24_4_;
    auVar90._28_4_ = auVar32._28_4_ + auVar32._28_4_ + auVar35._28_4_;
    local_420._0_4_ = auVar87._0_4_;
    local_420._4_4_ = auVar87._4_4_;
    fStack_418 = auVar87._8_4_;
    fStack_414 = auVar87._12_4_;
    fStack_410 = auVar87._16_4_;
    fStack_40c = auVar87._20_4_;
    fStack_408 = auVar87._24_4_;
    uStack_404 = auVar87._28_4_;
    auVar60._4_4_ = (float)local_420._4_4_ * (float)local_420._4_4_ * fVar91;
    auVar60._0_4_ = (float)local_420._0_4_ * (float)local_420._0_4_ * fVar147;
    auVar60._8_4_ = fStack_418 * fStack_418 * fVar92;
    auVar60._12_4_ = fStack_414 * fStack_414 * fVar93;
    auVar60._16_4_ = fStack_410 * fStack_410 * fVar94;
    auVar60._20_4_ = fStack_40c * fStack_40c * fVar95;
    auVar60._24_4_ = fStack_408 * fStack_408 * fVar96;
    auVar60._28_4_ = uStack_404;
    auVar32 = vcmpps_avx(auVar90,auVar60,1);
    auVar85 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
    auVar31 = vandnps_avx(auVar133,auVar36);
    auVar61._4_4_ = fVar178 * -fVar105;
    auVar61._0_4_ = fVar173 * -fVar98;
    auVar61._8_4_ = fVar179 * -fVar106;
    auVar61._12_4_ = fVar180 * -fVar107;
    auVar61._16_4_ = fVar181 * -fVar108;
    auVar61._20_4_ = fVar182 * -fVar109;
    auVar61._24_4_ = fVar183 * -fVar110;
    auVar61._28_4_ = local_260;
    auVar32 = vblendvps_avx(auVar213,auVar61,auVar32);
    auVar31 = vblendvps_avx(auVar213,auVar32,auVar31);
    auVar35 = vmaxps_avx(local_280,auVar31);
    auVar32 = vcmpps_avx(auVar213,auVar35,0);
    auVar190._8_4_ = 0xff800000;
    auVar190._0_8_ = 0xff800000ff800000;
    auVar190._12_4_ = 0xff800000;
    auVar190._16_4_ = 0xff800000;
    auVar190._20_4_ = 0xff800000;
    auVar190._24_4_ = 0xff800000;
    auVar190._28_4_ = 0xff800000;
    auVar32 = vblendvps_avx(auVar35,auVar190,auVar32);
    auVar35 = vminps_avx(local_280,auVar31);
    auVar31 = vcmpps_avx(auVar213,auVar35,0);
    auVar31 = vblendvps_avx(auVar35,auVar190,auVar31);
    auVar34 = vminps_avx(auVar33,auVar35);
    auVar35 = vcmpps_avx(auVar34,auVar35,0);
    auVar32 = vblendvps_avx(auVar31,auVar32,auVar35);
    auVar128._16_16_ = auVar85;
    auVar128._0_16_ = auVar85;
    auVar134._0_4_ = local_3e0 + auVar34._0_4_;
    auVar134._4_4_ = fStack_3dc + auVar34._4_4_;
    auVar134._8_4_ = fStack_3d8 + auVar34._8_4_;
    auVar134._12_4_ = fStack_3d4 + auVar34._12_4_;
    auVar134._16_4_ = fStack_3d0 + auVar34._16_4_;
    auVar134._20_4_ = fStack_3cc + auVar34._20_4_;
    auVar134._24_4_ = fStack_3c8 + auVar34._24_4_;
    auVar134._28_4_ = fStack_3c4 + auVar34._28_4_;
    auVar31 = vcmpps_avx(auVar128,auVar134,2);
    auVar99 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0);
    auVar103._16_16_ = auVar99;
    auVar103._0_16_ = auVar99;
    auVar35 = vcmpps_avx(auVar134,auVar103,2);
    auVar31 = vandps_avx(auVar35,auVar31);
    local_2a0 = vmaxps_avx(local_440,auVar32);
    auVar32 = vcmpps_avx(auVar213,auVar34,4);
    auVar32 = vandps_avx(auVar36,auVar32);
    local_4a0 = vandps_avx(auVar31,auVar32);
    local_5c0._0_4_ = local_3e0 + local_2a0._0_4_;
    local_5c0._4_4_ = fStack_3dc + local_2a0._4_4_;
    local_5c0._8_4_ = fStack_3d8 + local_2a0._8_4_;
    local_5c0._12_4_ = fStack_3d4 + local_2a0._12_4_;
    local_5c0._16_4_ = fStack_3d0 + local_2a0._16_4_;
    local_5c0._20_4_ = fStack_3cc + local_2a0._20_4_;
    local_5c0._24_4_ = fStack_3c8 + local_2a0._24_4_;
    local_5c0._28_4_ = fStack_3c4 + local_2a0._28_4_;
    auVar31 = vcmpps_avx(auVar128,local_5c0,2);
    auVar32 = vcmpps_avx(local_5c0,auVar103,2);
    auVar31 = vandps_avx(auVar32,auVar31);
    auVar32 = vcmpps_avx(local_2a0,auVar190,4);
    auVar32 = vandps_avx(auVar36,auVar32);
    local_480 = vandps_avx(auVar31,auVar32);
    local_4c0 = vorps_avx(local_4a0,local_480);
    if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4c0 >> 0x7f,0) != '\0') ||
          (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4c0 >> 0xbf,0) != '\0') ||
        (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4c0[0x1f] < '\0') {
      auVar35 = vblendvps_avx(local_2a0,auVar34,local_4a0);
      auVar34 = vblendvps_avx(_local_460,auVar126,local_4a0);
      fVar149 = (float)local_400._0_4_ * fVar118 * fVar149;
      fVar155 = (float)local_400._4_4_ * fVar194 * fVar155;
      fVar156 = fStack_3f8 * fVar204 * fVar156;
      fVar157 = fStack_3f4 * fVar15 * fVar157;
      fVar158 = fStack_3f0 * fVar20 * fVar158;
      fVar159 = fStack_3ec * fVar25 * fVar159;
      fVar160 = fStack_3e8 * fVar30 * fVar160;
      auVar31 = vcmpps_avx(auVar35,auVar33,0);
      auVar32 = vcmpps_avx(auVar35,local_440,0);
      auVar31 = vorps_avx(auVar31,auVar32);
      auVar31 = vandps_avx(auVar36,auVar31);
      auVar86 = vcmpps_avx(local_280,auVar35,0);
      auVar32 = vandps_avx(auVar36,auVar86);
      fVar118 = auVar35._0_4_;
      fVar204 = auVar35._4_4_;
      fVar20 = auVar35._8_4_;
      fVar25 = auVar35._12_4_;
      fVar30 = auVar35._16_4_;
      fVar91 = auVar35._20_4_;
      fVar93 = auVar35._24_4_;
      fStack_2bc = fVar121 * fVar155;
      local_2c0 = fVar187 * fVar149;
      fStack_2b8 = fVar200 * fVar156;
      fStack_2b4 = fVar13 * fVar157;
      fStack_2b0 = fVar18 * fVar158;
      fStack_2ac = fVar23 * fVar159;
      fStack_2a8 = fVar28 * fVar160;
      fStack_2a4 = auVar85._12_4_;
      auVar135._0_4_ = fVar187 * fVar149 + fVar129 * (local_240 * fVar118 + fVar117);
      auVar135._4_4_ = fVar121 * fVar155 + fVar137 * (local_240 * fVar204 + fVar207);
      auVar135._8_4_ = fVar200 * fVar156 + fVar138 * (local_240 * fVar20 + fVar208);
      auVar135._12_4_ = fVar13 * fVar157 + fVar139 * (local_240 * fVar25 + fVar209);
      auVar135._16_4_ = fVar18 * fVar158 + fVar140 * (local_240 * fVar30 + fVar210);
      auVar135._20_4_ = fVar23 * fVar159 + fVar141 * (local_240 * fVar91 + fVar211);
      auVar135._24_4_ = fVar28 * fVar160 + fVar142 * (local_240 * fVar93 + fVar212);
      auVar135._28_4_ = auVar85._12_4_ + auVar86._28_4_ + fStack_584;
      fStack_2fc = fVar121 * fStack_2dc;
      local_300 = fVar187 * local_2e0;
      fStack_2f8 = fVar200 * fStack_2d8;
      fStack_2f4 = fVar13 * fStack_2d4;
      fStack_2f0 = fVar18 * fStack_2d0;
      fStack_2ec = fVar23 * fStack_2cc;
      fStack_2e8 = fVar28 * fStack_2c8;
      uStack_2e4 = auVar33._28_4_;
      fVar194 = auVar34._0_4_;
      fVar15 = auVar34._4_4_;
      auVar62._4_4_ = fVar121 * fStack_2dc * fVar15;
      auVar62._0_4_ = fVar187 * local_2e0 * fVar194;
      fVar187 = auVar34._8_4_;
      auVar62._8_4_ = fVar200 * fStack_2d8 * fVar187;
      fVar121 = auVar34._12_4_;
      auVar62._12_4_ = fVar13 * fStack_2d4 * fVar121;
      fVar147 = auVar34._16_4_;
      auVar62._16_4_ = fVar18 * fStack_2d0 * fVar147;
      fVar92 = auVar34._20_4_;
      auVar62._20_4_ = fVar23 * fStack_2cc * fVar92;
      fVar94 = auVar34._24_4_;
      auVar62._24_4_ = fVar28 * fStack_2c8 * fVar94;
      auVar62._28_4_ = auVar33._28_4_;
      auVar34 = vsubps_avx(auVar135,auVar62);
      local_a0._0_8_ = local_3c0._0_8_ ^ 0x8000000080000000;
      local_a0._8_4_ = -fVar200;
      local_a0._12_4_ = -fVar13;
      local_a0._16_4_ = -fVar18;
      local_a0._20_4_ = -fVar23;
      local_a0._24_4_ = -fVar28;
      local_a0._28_4_ = uVar82 ^ 0x80000000;
      auVar36 = vblendvps_avx(local_3c0,local_a0,auVar32);
      local_4e0 = vblendvps_avx(auVar36,auVar34,auVar31);
      fStack_64 = local_4e0._28_4_;
      local_80 = fVar186 * fVar149;
      fStack_7c = fVar120 * fVar155;
      fStack_78 = fVar198 * fVar156;
      fStack_74 = fVar12 * fVar157;
      fStack_70 = fVar17 * fVar158;
      fStack_6c = fVar22 * fVar159;
      fStack_68 = fVar27 * fVar160;
      auVar136._0_4_ = fVar186 * fVar149 + fVar129 * (local_260 * fVar118 + fVar111);
      auVar136._4_4_ = fVar120 * fVar155 + fVar137 * (local_260 * fVar204 + fVar166);
      auVar136._8_4_ = fVar198 * fVar156 + fVar138 * (local_260 * fVar20 + fVar167);
      auVar136._12_4_ = fVar12 * fVar157 + fVar139 * (local_260 * fVar25 + fVar168);
      auVar136._16_4_ = fVar17 * fVar158 + fVar140 * (local_260 * fVar30 + fVar169);
      auVar136._20_4_ = fVar22 * fVar159 + fVar141 * (local_260 * fVar91 + fVar170);
      auVar136._24_4_ = fVar27 * fVar160 + fVar142 * (local_260 * fVar93 + fVar171);
      auVar136._28_4_ = fStack_64 + auVar34._28_4_ + fStack_5c4;
      fStack_31c = fVar120 * fStack_2dc;
      local_320 = fVar186 * local_2e0;
      fStack_318 = fVar198 * fStack_2d8;
      fStack_314 = fVar12 * fStack_2d4;
      fStack_310 = fVar17 * fStack_2d0;
      fStack_30c = fVar22 * fStack_2cc;
      fStack_308 = fVar27 * fStack_2c8;
      fStack_304 = fStack_64;
      auVar63._4_4_ = fVar15 * fVar120 * fStack_2dc;
      auVar63._0_4_ = fVar194 * fVar186 * local_2e0;
      auVar63._8_4_ = fVar187 * fVar198 * fStack_2d8;
      auVar63._12_4_ = fVar121 * fVar12 * fStack_2d4;
      auVar63._16_4_ = fVar147 * fVar17 * fStack_2d0;
      auVar63._20_4_ = fVar92 * fVar22 * fStack_2cc;
      auVar63._24_4_ = fVar94 * fVar27 * fStack_2c8;
      auVar63._28_4_ = local_280._28_4_;
      auVar34 = vsubps_avx(auVar136,auVar63);
      local_100._0_8_ = local_360._0_8_ ^ 0x8000000080000000;
      local_100._8_4_ = -fVar198;
      local_100._12_4_ = -fVar12;
      local_100._16_4_ = -fVar17;
      local_100._20_4_ = -fVar22;
      local_100._24_4_ = -fVar27;
      local_100._28_4_ = -fVar123;
      auVar36 = vblendvps_avx(local_360,local_100,auVar32);
      local_180 = vblendvps_avx(auVar36,auVar34,auVar31);
      local_2e0 = fVar172 * local_2e0;
      fStack_2dc = fVar119 * fStack_2dc;
      fStack_2d8 = fVar196 * fStack_2d8;
      fStack_2d4 = fVar11 * fStack_2d4;
      fStack_2d0 = fVar16 * fStack_2d0;
      fStack_2cc = fVar21 * fStack_2cc;
      fStack_2c8 = fVar26 * fStack_2c8;
      local_c0 = fVar172 * fVar149;
      fStack_bc = fVar119 * fVar155;
      fStack_b8 = fVar196 * fVar156;
      fStack_b4 = fVar11 * fVar157;
      fStack_b0 = fVar16 * fVar158;
      fStack_ac = fVar21 * fVar159;
      fStack_a8 = fVar26 * fVar160;
      fStack_a4 = auVar36._28_4_;
      auVar152._0_4_ = fVar172 * fVar149 + fVar129 * (fVar97 + fVar184 * fVar118);
      auVar152._4_4_ = fVar119 * fVar155 + fVar137 * (fVar122 + fVar184 * fVar204);
      auVar152._8_4_ = fVar196 * fVar156 + fVar138 * (fVar202 + fVar184 * fVar20);
      auVar152._12_4_ = fVar11 * fVar157 + fVar139 * (fVar14 + fVar184 * fVar25);
      auVar152._16_4_ = fVar16 * fVar158 + fVar140 * (fVar19 + fVar184 * fVar30);
      auVar152._20_4_ = fVar21 * fVar159 + fVar141 * (fVar24 + fVar184 * fVar91);
      auVar152._24_4_ = fVar26 * fVar160 + fVar142 * (fVar29 + fVar184 * fVar93);
      auVar152._28_4_ = auVar36._28_4_ + local_3a0._28_4_ + fStack_3e4;
      auVar34 = vrcpps_avx(_local_400);
      auVar64._4_4_ = fVar15 * fStack_2dc;
      auVar64._0_4_ = fVar194 * local_2e0;
      auVar64._8_4_ = fVar187 * fStack_2d8;
      auVar64._12_4_ = fVar121 * fStack_2d4;
      auVar64._16_4_ = fVar147 * fStack_2d0;
      auVar64._20_4_ = fVar92 * fStack_2cc;
      auVar64._24_4_ = fVar94 * fStack_2c8;
      auVar64._28_4_ = fVar143;
      auVar86 = vsubps_avx(auVar152,auVar64);
      local_120._0_8_ = local_380._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar196;
      local_120._12_4_ = -fVar11;
      local_120._16_4_ = -fVar16;
      local_120._20_4_ = -fVar21;
      local_120._24_4_ = -fVar26;
      local_120._28_4_ = local_380._28_4_ ^ 0x80000000;
      auVar36 = vblendvps_avx(local_380,local_120,auVar32);
      local_160 = vblendvps_avx(auVar36,auVar86,auVar31);
      local_e0 = auVar34._0_4_;
      fStack_dc = auVar34._4_4_;
      auVar65._4_4_ = fStack_dc * (float)local_400._4_4_;
      auVar65._0_4_ = local_e0 * (float)local_400._0_4_;
      fStack_d8 = auVar34._8_4_;
      auVar65._8_4_ = fStack_d8 * fStack_3f8;
      fStack_d4 = auVar34._12_4_;
      auVar65._12_4_ = fStack_d4 * fStack_3f4;
      fStack_d0 = auVar34._16_4_;
      auVar65._16_4_ = fStack_d0 * fStack_3f0;
      fStack_cc = auVar34._20_4_;
      auVar65._20_4_ = fStack_cc * fStack_3ec;
      fStack_c8 = auVar34._24_4_;
      auVar65._24_4_ = fStack_c8 * fStack_3e8;
      auVar65._28_4_ = fStack_3e4;
      auVar185._8_4_ = 0x3f800000;
      auVar185._0_8_ = &DAT_3f8000003f800000;
      auVar185._12_4_ = 0x3f800000;
      auVar185._16_4_ = 0x3f800000;
      auVar185._20_4_ = 0x3f800000;
      auVar185._24_4_ = 0x3f800000;
      auVar185._28_4_ = 0x3f800000;
      auVar36 = vsubps_avx(auVar185,auVar65);
      _local_400 = vblendvps_avx(auVar185,ZEXT432(0) << 0x40,auVar32);
      local_e0 = local_e0 + local_e0 * auVar36._0_4_;
      fStack_dc = fStack_dc + fStack_dc * auVar36._4_4_;
      fStack_d8 = fStack_d8 + fStack_d8 * auVar36._8_4_;
      fStack_d4 = fStack_d4 + fStack_d4 * auVar36._12_4_;
      fStack_d0 = fStack_d0 + fStack_d0 * auVar36._16_4_;
      fStack_cc = fStack_cc + fStack_cc * auVar36._20_4_;
      fStack_c8 = fStack_c8 + fStack_c8 * auVar36._24_4_;
      fStack_c4 = auVar34._28_4_ + auVar36._28_4_;
      auVar66._4_4_ = fVar15 * fStack_dc;
      auVar66._0_4_ = fVar194 * local_e0;
      auVar66._8_4_ = fVar187 * fStack_d8;
      auVar66._12_4_ = fVar121 * fStack_d4;
      auVar66._16_4_ = fVar147 * fStack_d0;
      auVar66._20_4_ = fVar92 * fStack_cc;
      auVar66._24_4_ = fVar94 * fStack_c8;
      auVar66._28_4_ = fStack_c4;
      local_200 = vblendvps_avx(_local_400,auVar66,auVar31);
      local_1e0 = ZEXT432(0) << 0x40;
      local_1c0._4_4_ = fVar204 + fStack_3dc;
      local_1c0._0_4_ = fVar118 + local_3e0;
      fStack_1b8 = fVar20 + fStack_3d8;
      fStack_1b4 = fVar25 + fStack_3d4;
      fStack_1b0 = fVar30 + fStack_3d0;
      fStack_1ac = fVar91 + fStack_3cc;
      fStack_1a8 = fVar93 + fStack_3c8;
      fStack_1a4 = auVar35._28_4_ + fStack_3c4;
      local_1a0 = local_4e0;
      uVar82 = vmovmskps_avx(local_4c0);
      uVar81 = (ulong)uVar82;
      lVar77 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar154 = ZEXT3264(local_360);
      auVar177 = ZEXT3264(local_380);
      auVar206 = ZEXT3264(local_3a0);
      auVar214 = ZEXT3264(local_3c0);
      auVar191 = ZEXT3264(local_5c0);
      fVar172 = fStack_5c4;
      fVar186 = fVar184;
      fVar187 = fVar184;
      fVar97 = fVar184;
      fVar118 = fVar184;
      fVar119 = fVar184;
      fVar120 = fVar184;
      fVar121 = fStack_584;
      local_628 = pSVar78;
      local_620 = k;
      local_5e8 = line;
      _local_420 = auVar33;
      local_340 = fVar184;
      fStack_33c = fVar184;
      fStack_338 = fVar184;
      fStack_334 = fVar184;
      fStack_330 = fVar184;
      fStack_32c = fVar184;
      fStack_328 = fVar184;
      fStack_324 = fVar184;
      fStack_25c = local_260;
      fStack_258 = local_260;
      fStack_254 = local_260;
      fStack_250 = local_260;
      fStack_24c = local_260;
      fStack_248 = local_260;
      fStack_244 = local_260;
      fStack_23c = local_240;
      fStack_238 = local_240;
      fStack_234 = local_240;
      fStack_230 = local_240;
      fStack_22c = local_240;
      fStack_228 = local_240;
      fStack_224 = local_240;
      do {
        local_618.hit = local_570;
        uVar10 = 0;
        if (uVar81 != 0) {
          for (; (uVar81 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar82 = *(uint *)(local_220 + uVar10 * 4);
        pGVar8 = (pSVar78->geometries).items[uVar82].ptr;
        local_618.ray = (RTCRayN *)ray;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar81 = uVar81 ^ 1L << (uVar10 & 0x3f);
          bVar83 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar83 = false;
        }
        else {
          local_3e0 = *(float *)(ray + k * 4 + 0x80);
          local_540._4_4_ = *(undefined4 *)(local_200 + uVar10 * 4);
          uVar80 = *(undefined4 *)(local_1e0 + uVar10 * 4);
          local_530._4_4_ = uVar80;
          local_530._0_4_ = uVar80;
          local_530._8_4_ = uVar80;
          local_530._12_4_ = uVar80;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar10 * 4);
          local_618.context = context->user;
          local_510 = vpshufd_avx(ZEXT416(uVar82),0);
          uVar82 = (local_5e8->primIDs).field_0.i[uVar10];
          local_520._4_4_ = uVar82;
          local_520._0_4_ = uVar82;
          local_520._8_4_ = uVar82;
          local_520._12_4_ = uVar82;
          uVar80 = *(undefined4 *)(local_1a0 + uVar10 * 4);
          local_570._4_4_ = uVar80;
          local_570._0_4_ = uVar80;
          local_570._8_4_ = uVar80;
          local_570._12_4_ = uVar80;
          uVar80 = *(undefined4 *)(local_180 + uVar10 * 4);
          local_560._4_4_ = uVar80;
          local_560._0_4_ = uVar80;
          local_560._8_4_ = uVar80;
          local_560._12_4_ = uVar80;
          uVar80 = *(undefined4 *)(local_160 + uVar10 * 4);
          local_550._4_4_ = uVar80;
          local_550._0_4_ = uVar80;
          local_550._8_4_ = uVar80;
          local_550._12_4_ = uVar80;
          local_540._0_4_ = local_540._4_4_;
          local_540._8_4_ = local_540._4_4_;
          local_540._12_4_ = local_540._4_4_;
          vcmpps_avx(ZEXT1632((undefined1  [16])0x0),ZEXT1632((undefined1  [16])0x0),0xf);
          uStack_4fc = (local_618.context)->instID[0];
          local_500 = uStack_4fc;
          uStack_4f8 = uStack_4fc;
          uStack_4f4 = uStack_4fc;
          uStack_4f0 = (local_618.context)->instPrimID[0];
          uStack_4ec = uStack_4f0;
          uStack_4e8 = uStack_4f0;
          uStack_4e4 = uStack_4f0;
          local_640 = *(undefined8 *)(mm_lookupmask_ps + lVar77);
          uStack_638 = *(undefined8 *)(mm_lookupmask_ps + lVar77 + 8);
          local_618.valid = (int *)&local_640;
          local_618.geometryUserPtr = pGVar8->userPtr;
          local_618.N = 4;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar8->occlusionFilterN)(&local_618);
            auVar191 = ZEXT3264(local_5c0);
            auVar214 = ZEXT3264(local_3c0);
            auVar206 = ZEXT3264(local_3a0);
            auVar177 = ZEXT3264(local_380);
            auVar154 = ZEXT3264(local_360);
            pSVar78 = local_628;
            fVar111 = (float)local_5e0._0_4_;
            fVar166 = (float)local_5e0._4_4_;
            fVar167 = fStack_5d8;
            fVar168 = fStack_5d4;
            fVar169 = fStack_5d0;
            fVar170 = fStack_5cc;
            fVar171 = fStack_5c8;
            fVar172 = fStack_5c4;
            fVar184 = local_340;
            fVar186 = fStack_33c;
            fVar187 = fStack_338;
            fVar97 = fStack_334;
            fVar118 = fStack_330;
            fVar119 = fStack_32c;
            fVar120 = fStack_328;
            fVar117 = (float)local_5a0._0_4_;
            fVar207 = (float)local_5a0._4_4_;
            fVar208 = fStack_598;
            fVar209 = fStack_594;
            fVar210 = fStack_590;
            fVar211 = fStack_58c;
            fVar212 = fStack_588;
            fVar121 = fStack_584;
          }
          auVar85._8_8_ = uStack_638;
          auVar85._0_8_ = local_640;
          if (auVar85 == (undefined1  [16])0x0) {
            auVar99 = ZEXT816(0) << 0x40;
            auVar85 = vpcmpeqd_avx((undefined1  [16])0x0,auVar99);
            auVar99 = vpcmpeqd_avx(auVar99,auVar99);
            auVar85 = auVar85 ^ auVar99;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var9)(&local_618);
              auVar191 = ZEXT3264(local_5c0);
              auVar214 = ZEXT3264(local_3c0);
              auVar206 = ZEXT3264(local_3a0);
              auVar177 = ZEXT3264(local_380);
              auVar154 = ZEXT3264(local_360);
              pSVar78 = local_628;
              fVar111 = (float)local_5e0._0_4_;
              fVar166 = (float)local_5e0._4_4_;
              fVar167 = fStack_5d8;
              fVar168 = fStack_5d4;
              fVar169 = fStack_5d0;
              fVar170 = fStack_5cc;
              fVar171 = fStack_5c8;
              fVar172 = fStack_5c4;
              fVar184 = local_340;
              fVar186 = fStack_33c;
              fVar187 = fStack_338;
              fVar97 = fStack_334;
              fVar118 = fStack_330;
              fVar119 = fStack_32c;
              fVar120 = fStack_328;
              fVar117 = (float)local_5a0._0_4_;
              fVar207 = (float)local_5a0._4_4_;
              fVar208 = fStack_598;
              fVar209 = fStack_594;
              fVar210 = fStack_590;
              fVar211 = fStack_58c;
              fVar212 = fStack_588;
              fVar121 = fStack_584;
            }
            auVar99._8_8_ = uStack_638;
            auVar99._0_8_ = local_640;
            auVar99 = vpcmpeqd_avx((undefined1  [16])0x0,auVar99);
            auVar85 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar85 = auVar99 ^ auVar85;
            auVar112._8_4_ = 0xff800000;
            auVar112._0_8_ = 0xff800000ff800000;
            auVar112._12_4_ = 0xff800000;
            auVar99 = vblendvps_avx(auVar112,*(undefined1 (*) [16])(local_618.ray + 0x80),auVar99);
            *(undefined1 (*) [16])(local_618.ray + 0x80) = auVar99;
          }
          auVar85 = vpslld_avx(auVar85,0x1f);
          bVar72 = (auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar73 = (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar71 = (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar84 = -1 < auVar85[0xf];
          bVar83 = ((bVar72 && bVar73) && bVar71) && bVar84;
          if (((bVar72 && bVar73) && bVar71) && bVar84) {
            *(float *)(ray + k * 4 + 0x80) = local_3e0;
            uVar81 = uVar81 ^ 1L << (uVar10 & 0x3f);
          }
        }
      } while ((bVar83 != false) && (uVar81 != 0));
      auVar31 = vandps_avx(local_480,local_4a0);
      uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar104._4_4_ = uVar80;
      auVar104._0_4_ = uVar80;
      auVar104._8_4_ = uVar80;
      auVar104._12_4_ = uVar80;
      auVar104._16_4_ = uVar80;
      auVar104._20_4_ = uVar80;
      auVar104._24_4_ = uVar80;
      auVar104._28_4_ = uVar80;
      auVar32 = vcmpps_avx(auVar191._0_32_,auVar104,2);
      auVar35 = auVar31 & auVar32;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar35 >> 0x7f,0) == '\0') &&
            (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar35 >> 0xbf,0) == '\0') &&
          (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar35[0x1f])
      {
        return (bool)(bVar83 ^ 1U);
      }
      auVar33 = vcmpps_avx(local_2a0,local_280,0);
      auVar35 = vblendvps_avx(auVar214._0_32_,local_a0,auVar33);
      auVar36 = vblendvps_avx(auVar154._0_32_,local_100,auVar33);
      auVar33 = vblendvps_avx(auVar177._0_32_,local_120,auVar33);
      auVar34 = vcmpps_avx(local_2a0,_local_420,0);
      auVar86 = vcmpps_avx(local_2a0,local_440,0);
      auVar34 = vorps_avx(auVar34,auVar86);
      fVar122 = local_2a0._0_4_;
      fVar194 = local_2a0._4_4_;
      fVar196 = local_2a0._8_4_;
      fVar198 = local_2a0._12_4_;
      fVar200 = local_2a0._16_4_;
      fVar202 = local_2a0._20_4_;
      fVar204 = local_2a0._24_4_;
      auVar146._0_4_ = (float)local_140._0_4_ * (fVar117 + fVar122 * local_240) + local_2c0;
      auVar146._4_4_ = (float)local_140._4_4_ * (fVar207 + fVar194 * fStack_23c) + fStack_2bc;
      auVar146._8_4_ = fStack_138 * (fVar208 + fVar196 * fStack_238) + fStack_2b8;
      auVar146._12_4_ = fStack_134 * (fVar209 + fVar198 * fStack_234) + fStack_2b4;
      auVar146._16_4_ = fStack_130 * (fVar210 + fVar200 * fStack_230) + fStack_2b0;
      auVar146._20_4_ = fStack_12c * (fVar211 + fVar202 * fStack_22c) + fStack_2ac;
      auVar146._24_4_ = fStack_128 * (fVar212 + fVar204 * fStack_228) + fStack_2a8;
      auVar146._28_4_ = fVar121 + auVar86._28_4_ + fStack_2a4;
      auVar153._0_4_ = (float)local_140._0_4_ * (fVar111 + fVar122 * local_260) + local_80;
      auVar153._4_4_ = (float)local_140._4_4_ * (fVar166 + fVar194 * fStack_25c) + fStack_7c;
      auVar153._8_4_ = fStack_138 * (fVar167 + fVar196 * fStack_258) + fStack_78;
      auVar153._12_4_ = fStack_134 * (fVar168 + fVar198 * fStack_254) + fStack_74;
      auVar153._16_4_ = fStack_130 * (fVar169 + fVar200 * fStack_250) + fStack_70;
      auVar153._20_4_ = fStack_12c * (fVar170 + fVar202 * fStack_24c) + fStack_6c;
      auVar153._24_4_ = fStack_128 * (fVar171 + fVar204 * fStack_248) + fStack_68;
      auVar153._28_4_ = fVar172 + auVar154._28_4_ + fStack_64;
      auVar165._0_4_ = (float)local_140._0_4_ * (auVar206._0_4_ + fVar184 * fVar122) + local_c0;
      auVar165._4_4_ = (float)local_140._4_4_ * (auVar206._4_4_ + fVar186 * fVar194) + fStack_bc;
      auVar165._8_4_ = fStack_138 * (auVar206._8_4_ + fVar187 * fVar196) + fStack_b8;
      auVar165._12_4_ = fStack_134 * (auVar206._12_4_ + fVar97 * fVar198) + fStack_b4;
      auVar165._16_4_ = fStack_130 * (auVar206._16_4_ + fVar118 * fVar200) + fStack_b0;
      auVar165._20_4_ = fStack_12c * (auVar206._20_4_ + fVar119 * fVar202) + fStack_ac;
      auVar165._24_4_ = fStack_128 * (auVar206._24_4_ + fVar120 * fVar204) + fStack_a8;
      auVar165._28_4_ = auVar206._28_4_ + fVar172 + fStack_a4;
      auVar174._0_4_ = (float)local_460._0_4_ * local_300;
      auVar174._4_4_ = (float)local_460._4_4_ * fStack_2fc;
      auVar174._8_4_ = fStack_458 * fStack_2f8;
      auVar174._12_4_ = fStack_454 * fStack_2f4;
      auVar67._16_4_ = fStack_450 * fStack_2f0;
      auVar67._0_16_ = auVar174;
      auVar67._20_4_ = fStack_44c * fStack_2ec;
      auVar67._24_4_ = fStack_448 * fStack_2e8;
      auVar67._28_4_ = uStack_124;
      auVar86 = vsubps_avx(auVar146,auVar67);
      local_1a0 = vblendvps_avx(auVar35,auVar86,auVar34);
      auVar68._4_4_ = (float)local_460._4_4_ * fStack_31c;
      auVar68._0_4_ = (float)local_460._0_4_ * local_320;
      auVar68._8_4_ = fStack_458 * fStack_318;
      auVar68._12_4_ = fStack_454 * fStack_314;
      auVar68._16_4_ = fStack_450 * fStack_310;
      auVar68._20_4_ = fStack_44c * fStack_30c;
      auVar68._24_4_ = fStack_448 * fStack_308;
      auVar68._28_4_ = auVar86._28_4_;
      auVar35 = vsubps_avx(auVar153,auVar68);
      local_180 = vblendvps_avx(auVar36,auVar35,auVar34);
      auVar69._4_4_ = (float)local_460._4_4_ * fStack_2dc;
      auVar69._0_4_ = (float)local_460._0_4_ * local_2e0;
      auVar69._8_4_ = fStack_458 * fStack_2d8;
      auVar69._12_4_ = fStack_454 * fStack_2d4;
      auVar69._16_4_ = fStack_450 * fStack_2d0;
      auVar69._20_4_ = fStack_44c * fStack_2cc;
      auVar69._24_4_ = fStack_448 * fStack_2c8;
      auVar69._28_4_ = auVar35._28_4_;
      auVar35 = vsubps_avx(auVar165,auVar69);
      local_160 = vblendvps_avx(auVar33,auVar35,auVar34);
      auVar70._4_4_ = (float)local_460._4_4_ * fStack_dc;
      auVar70._0_4_ = (float)local_460._0_4_ * local_e0;
      auVar70._8_4_ = fStack_458 * fStack_d8;
      auVar70._12_4_ = fStack_454 * fStack_d4;
      auVar70._16_4_ = fStack_450 * fStack_d0;
      auVar70._20_4_ = fStack_44c * fStack_cc;
      auVar70._24_4_ = fStack_448 * fStack_c8;
      auVar70._28_4_ = auVar35._28_4_;
      local_200 = vblendvps_avx(_local_400,auVar70,auVar34);
      auVar31 = vandps_avx(auVar32,auVar31);
      auVar154 = ZEXT864(0) << 0x20;
      local_1e0 = ZEXT832(0) << 0x20;
      _local_1c0 = auVar191._0_32_;
      auVar79 = (undefined1  [8])context->scene;
      lVar77 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      uVar80 = vmovmskps_avx(auVar31);
      uVar81 = CONCAT44((int)(uVar10 >> 0x20),uVar80);
      auVar177 = ZEXT464(0) << 0x20;
      auVar85 = vpcmpeqd_avx(auVar174,auVar174);
      auVar191 = ZEXT1664(auVar85);
      do {
        local_618.hit = local_570;
        uVar10 = 0;
        if (uVar81 != 0) {
          for (; (uVar81 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar82 = *(uint *)(local_220 + uVar10 * 4);
        pGVar8 = (((Scene *)auVar79)->geometries).items[uVar82].ptr;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar81 = uVar81 ^ 1L << (uVar10 & 0x3f);
          bVar84 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar84 = false;
        }
        else {
          local_5a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
          uVar80 = *(undefined4 *)(local_200 + uVar10 * 4);
          local_540._4_4_ = uVar80;
          local_540._0_4_ = uVar80;
          local_540._8_4_ = uVar80;
          local_540._12_4_ = uVar80;
          uVar80 = *(undefined4 *)(local_1e0 + uVar10 * 4);
          local_530._4_4_ = uVar80;
          local_530._0_4_ = uVar80;
          local_530._8_4_ = uVar80;
          local_530._12_4_ = uVar80;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar10 * 4);
          local_618.context = context->user;
          local_510 = vpshufd_avx(ZEXT416(uVar82),0);
          uVar82 = (local_5e8->primIDs).field_0.i[uVar10];
          local_520._4_4_ = uVar82;
          local_520._0_4_ = uVar82;
          local_520._8_4_ = uVar82;
          local_520._12_4_ = uVar82;
          uVar80 = *(undefined4 *)(local_1a0 + uVar10 * 4);
          local_570._4_4_ = uVar80;
          local_570._0_4_ = uVar80;
          local_570._8_4_ = uVar80;
          local_570._12_4_ = uVar80;
          uVar80 = *(undefined4 *)(local_180 + uVar10 * 4);
          local_560._4_4_ = uVar80;
          local_560._0_4_ = uVar80;
          local_560._8_4_ = uVar80;
          local_560._12_4_ = uVar80;
          uVar80 = *(undefined4 *)(local_160 + uVar10 * 4);
          local_550._4_4_ = uVar80;
          local_550._0_4_ = uVar80;
          local_550._8_4_ = uVar80;
          local_550._12_4_ = uVar80;
          vcmpps_avx(auVar154._0_32_,auVar154._0_32_,0xf);
          uStack_4fc = (local_618.context)->instID[0];
          local_500 = uStack_4fc;
          uStack_4f8 = uStack_4fc;
          uStack_4f4 = uStack_4fc;
          uStack_4f0 = (local_618.context)->instPrimID[0];
          uStack_4ec = uStack_4f0;
          uStack_4e8 = uStack_4f0;
          uStack_4e4 = uStack_4f0;
          local_640 = *(undefined8 *)(mm_lookupmask_ps + lVar77);
          uStack_638 = *(undefined8 *)(mm_lookupmask_ps + lVar77 + 8);
          local_618.valid = (int *)&local_640;
          local_618.geometryUserPtr = pGVar8->userPtr;
          local_618.N = 4;
          local_5e0 = auVar79;
          local_618.ray = (RTCRayN *)ray;
          if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar85 = auVar191._0_16_;
            (*pGVar8->occlusionFilterN)(&local_618);
            auVar85 = vpcmpeqd_avx(auVar85,auVar85);
            auVar191 = ZEXT1664(auVar85);
            auVar177 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar154 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar79 = local_5e0;
            k = local_620;
          }
          auVar75._8_8_ = uStack_638;
          auVar75._0_8_ = local_640;
          auVar85 = auVar191._0_16_;
          if (auVar75 == (undefined1  [16])0x0) {
            auVar99 = vpcmpeqd_avx(auVar177._0_16_,(undefined1  [16])0x0);
            auVar85 = auVar85 ^ auVar99;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var9)(&local_618);
              auVar85 = vpcmpeqd_avx(auVar85,auVar85);
              auVar191 = ZEXT1664(auVar85);
              auVar177 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar154 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar79 = local_5e0;
              k = local_620;
            }
            auVar76._8_8_ = uStack_638;
            auVar76._0_8_ = local_640;
            auVar99 = vpcmpeqd_avx(auVar177._0_16_,auVar76);
            auVar85 = auVar191._0_16_ ^ auVar99;
            auVar113._8_4_ = 0xff800000;
            auVar113._0_8_ = 0xff800000ff800000;
            auVar113._12_4_ = 0xff800000;
            auVar99 = vblendvps_avx(auVar113,*(undefined1 (*) [16])(local_618.ray + 0x80),auVar99);
            *(undefined1 (*) [16])(local_618.ray + 0x80) = auVar99;
          }
          auVar85 = vpslld_avx(auVar85,0x1f);
          bVar73 = (auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar74 = (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar72 = (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar71 = -1 < auVar85[0xf];
          bVar84 = ((bVar73 && bVar74) && bVar72) && bVar71;
          if (((bVar73 && bVar74) && bVar72) && bVar71) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_5a0._0_4_;
            uVar81 = uVar81 ^ 1L << (uVar10 & 0x3f);
          }
        }
      } while ((bVar84 != false) && (uVar81 != 0));
      return (bool)(bVar83 ^ 1U | bVar84 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }